

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullable.hpp
# Opt level: O0

Nullable<LiteScript::Variable> * __thiscall
LiteScript::Nullable<LiteScript::Variable>::operator=
          (Nullable<LiteScript::Variable> *this,Nullable<LiteScript::Variable> *v)

{
  bool bVar1;
  allocator<LiteScript::Variable> local_21;
  Nullable<LiteScript::Variable> *pNStack_20;
  allocator<LiteScript::Variable> allocator;
  Nullable<LiteScript::Variable> *v_local;
  Nullable<LiteScript::Variable> *this_local;
  
  if (this != v) {
    pNStack_20 = v;
    Nullify(this);
    bVar1 = pNStack_20->is_null;
    this->is_null = (bool)(bVar1 & 1);
    if ((bVar1 & 1U) == 0) {
      std::allocator<LiteScript::Variable>::allocator(&local_21);
      __gnu_cxx::new_allocator<LiteScript::Variable>::
      construct<LiteScript::Variable,LiteScript::Variable_const&>
                ((new_allocator<LiteScript::Variable> *)&local_21,(Variable *)this,
                 (Variable *)pNStack_20);
      std::allocator<LiteScript::Variable>::~allocator(&local_21);
    }
  }
  return this;
}

Assistant:

Nullable<T>& operator=(const Nullable<T>& v) {
            if (this == &v)
                return *this;
            this->Nullify();
            if (!(this->is_null = v.is_null)) {
                std::allocator<T> allocator;
                allocator.construct((T *)this->data, *(const T *)v.data);
            }
            return *this;
        }